

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

SerialArena * __thiscall
google::protobuf::internal::SerialArena::New(SerialArena *this,SizedPtr mem,ThreadSafeArena *parent)

{
  ThreadSafeArena *this_00;
  char *failure_msg;
  LogMessage *pLVar1;
  ThreadSafeArenaStats *pTVar2;
  SerialArena *this_01;
  ArenaBlock *b;
  LogMessage local_50;
  Voidify local_39;
  unsigned_long local_38;
  unsigned_long local_30;
  Nullable<const_char_*> local_28;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  ThreadSafeArena *parent_local;
  SizedPtr mem_local;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)mem.n;
  mem_local.p = mem.p;
  parent_local = (ThreadSafeArena *)this;
  local_30 = absl::lts_20250127::log_internal::GetReferenceableValue(0x88);
  local_38 = absl::lts_20250127::log_internal::GetReferenceableValue((unsigned_long)mem_local.p);
  local_28 = absl::lts_20250127::log_internal::Check_LEImpl<unsigned_long,unsigned_long>
                       (&local_30,&local_38,
                        "kBlockHeaderSize + ThreadSafeArena::kSerialArenaSize <= mem.n");
  if (local_28 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_28);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena.cc"
               ,0xf1,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  pTVar2 = ThreadSafeArenaStatsHandle::MutableStats
                     ((ThreadSafeArenaStatsHandle *)(absl_log_internal_check_op_result + 0x10));
  ThreadSafeArenaStats::RecordAllocateStats(pTVar2,0,(size_t)mem_local.p,0);
  this_00 = parent_local;
  ArenaBlock::ArenaBlock((ArenaBlock *)parent_local,(ArenaBlock *)0x0,(size_t)mem_local.p);
  this_01 = (SerialArena *)ArenaBlock::Pointer((ArenaBlock *)this_00,0x10);
  SerialArena(this_01,(ArenaBlock *)this_00,(ThreadSafeArena *)absl_log_internal_check_op_result);
  return this_01;
}

Assistant:

SerialArena* SerialArena::New(SizedPtr mem, ThreadSafeArena& parent) {
  ABSL_DCHECK_LE(kBlockHeaderSize + ThreadSafeArena::kSerialArenaSize, mem.n);
  ThreadSafeArenaStats::RecordAllocateStats(parent.arena_stats_.MutableStats(),
                                            /*used=*/0, /*allocated=*/mem.n,
                                            /*wasted=*/0);
  auto b = new (mem.p) ArenaBlock{nullptr, mem.n};
  return new (b->Pointer(kBlockHeaderSize)) SerialArena(b, parent);
}